

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

CURLcode sendf(Curl_easy *data,char *fmt,...)

{
  char in_AL;
  CURLcode CVar1;
  char *__s;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_118 [16];
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined1 local_68 [8];
  va_list ap;
  char *local_48;
  char *sptr;
  char *s;
  size_t sStack_30;
  CURLcode result;
  size_t write_len;
  size_t bytes_written;
  char *fmt_local;
  Curl_easy *data_local;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = local_118;
  ap[0]._0_8_ = &stack0x00000008;
  local_68._4_4_ = 0x30;
  local_68._0_4_ = 0x10;
  local_108 = in_RDX;
  local_100 = in_RCX;
  local_f8 = in_R8;
  local_f0 = in_R9;
  bytes_written = (size_t)fmt;
  fmt_local = (char *)data;
  __s = curl_mvaprintf(fmt,(__va_list_tag *)local_68);
  if (__s == (char *)0x0) {
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    write_len = 0;
    sStack_30 = strlen(__s);
    local_48 = __s;
    for (; (CVar1 = Curl_xfer_send((Curl_easy *)fmt_local,local_48,sStack_30,false,&write_len),
           CVar1 == CURLE_OK &&
           (Curl_debug((Curl_easy *)fmt_local,CURLINFO_DATA_OUT,local_48,write_len),
           write_len != sStack_30)); sStack_30 = sStack_30 - write_len) {
      local_48 = local_48 + write_len;
    }
    (*Curl_cfree)(__s);
    data_local._4_4_ = CVar1;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode sendf(struct Curl_easy *data, const char *fmt, ...)
{
  size_t bytes_written;
  size_t write_len;
  CURLcode result = CURLE_OK;
  char *s;
  char *sptr;
  va_list ap;
  va_start(ap, fmt);
  s = vaprintf(fmt, ap); /* returns an allocated string */
  va_end(ap);
  if(!s)
    return CURLE_OUT_OF_MEMORY; /* failure */

  bytes_written = 0;
  write_len = strlen(s);
  sptr = s;

  for(;;) {
    /* Write the buffer to the socket */
    result = Curl_xfer_send(data, sptr, write_len, FALSE, &bytes_written);

    if(result)
      break;

    Curl_debug(data, CURLINFO_DATA_OUT, sptr, (size_t)bytes_written);

    if((size_t)bytes_written != write_len) {
      /* if not all was written at once, we must advance the pointer, decrease
         the size left and try again! */
      write_len -= bytes_written;
      sptr += bytes_written;
    }
    else
      break;
  }

  free(s); /* free the output string */

  return result;
}